

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

iterator __thiscall
QHash<QStringView,QXmlStreamReaderPrivate::Entity>::
emplace_helper<QXmlStreamReaderPrivate::Entity_const&>
          (QHash<QStringView,QXmlStreamReaderPrivate::Entity> *this,QStringView *key,Entity *args)

{
  storage_type_conflict *psVar1;
  piter pVar2;
  Node<QStringView,QXmlStreamReaderPrivate::Entity> *this_00;
  long in_FS_OFFSET;
  undefined1 local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::Node<QStringView,_QXmlStreamReaderPrivate::Entity>_>::
  findOrInsert<QStringView>
            ((InsertionResult *)local_38,
             *(Data<QHashPrivate::Node<QStringView,_QXmlStreamReaderPrivate::Entity>_> **)this,key);
  this_00 = (Node<QStringView,QXmlStreamReaderPrivate::Entity> *)
            ((*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].entries +
            (*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].offsets
            [(uint)local_38._8_8_ & 0x7f]);
  if (local_38[0x10] == false) {
    psVar1 = key->m_data;
    *(qsizetype *)this_00 = key->m_size;
    *(storage_type_conflict **)(this_00 + 8) = psVar1;
    QXmlStreamReaderPrivate::Entity::Entity((Entity *)(this_00 + 0x10),args);
  }
  else {
    QHashPrivate::Node<QStringView,QXmlStreamReaderPrivate::Entity>::
    emplaceValue<QXmlStreamReaderPrivate::Entity_const&>(this_00,args);
  }
  pVar2.bucket = local_38._8_8_;
  pVar2.d = (Data<QHashPrivate::Node<QStringView,_QXmlStreamReaderPrivate::Entity>_> *)
            local_38._0_8_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar2;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }